

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array
          (Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> *this)

{
  FrameBuffer *pFVar1;
  Array2D<Imf_3_2::FrameBuffer> *pAVar2;
  long in_RDI;
  Array2D<Imf_3_2::FrameBuffer> *local_18;
  Array2D<Imf_3_2::FrameBuffer> *this_00;
  
  this_00 = *(Array2D<Imf_3_2::FrameBuffer> **)(in_RDI + 8);
  if (this_00 != (Array2D<Imf_3_2::FrameBuffer> *)0x0) {
    pAVar2 = this_00 + -1;
    pFVar1 = this_00[-1]._data;
    local_18 = this_00 + (long)pFVar1;
    if (this_00 != local_18) {
      do {
        local_18 = local_18 + -1;
        Array2D<Imf_3_2::FrameBuffer>::~Array2D(this_00);
      } while (local_18 != this_00);
    }
    operator_delete__(&pAVar2->_data,(long)pFVar1 * 0x18 + 8);
  }
  return;
}

Assistant:

~Array () { delete[] _data; }